

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

void __thiscall toktxApp::validateOptions(toktxApp *this)

{
  float fVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  ktxApp *in_RDI;
  ktx_uint32_t requiredInputFiles;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  scApp::validateOptions((scApp *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (1 < *(int *)&in_RDI[5].defaultVersion + *(int *)&in_RDI[5].options +
          *(int *)&in_RDI[5].option_list.
                   super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl
                   .super__Vector_impl_data._M_start) {
    ktxApp::error(in_RDI,"only one of --automipmap, --genmipmap and --mipmap may be specified.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  if (((*(int *)&in_RDI[5].defaultVersion != 0) || (*(int *)&in_RDI[5].options != 0)) &&
     (1 < *(uint *)&in_RDI[6].name.field_2)) {
    ktxApp::error(in_RDI,"cannot specify --levels > 1 with --automipmap or --genmipmap.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  if ((*(int *)((long)&in_RDI[5].defaultVersion + 4) != 0) &&
     (*(int *)&in_RDI[5].short_opts.field_0x4 != 0)) {
    ktxApp::error(in_RDI,
                  "cubemaps require images to have an upper-left origin. Ignoring --lower_left_maps_to_s0t0."
                 );
    *(undefined4 *)&in_RDI[5].short_opts.field_0x4 = 0;
  }
  if ((*(int *)((long)&in_RDI[5].defaultVersion + 4) != 0) &&
     ((int)in_RDI[6].name._M_string_length != 0)) {
    ktxApp::error(in_RDI,"cubemaps cannot have 3D textures.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  if ((*(int *)((long)&in_RDI[6].name._M_string_length + 4) != 0) &&
     ((int)in_RDI[6].name._M_string_length != 0)) {
    ktxApp::error(in_RDI,"cannot have 3D array textures.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  fVar1 = *(float *)((long)&in_RDI[6].name.field_2 + 4);
  if (((fVar1 != 1.0) || (NAN(fVar1))) && (*(int *)((long)&in_RDI[6].name.field_2 + 8) != 0)) {
    ktxApp::error(in_RDI,"only one of --scale and --resize can be specified.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  if ((*(int *)((long)&in_RDI[6].name.field_2 + 8) != 0) &&
     (*(int *)&in_RDI[5].option_list.
               super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl.
               super__Vector_impl_data._M_start != 0)) {
    ktxApp::error(in_RDI,"only one of --resize and --mipmap can be specified.");
    (*in_RDI->_vptr_ktxApp[1])();
    exit(1);
  }
  if ((1 < (uint)in_RDI[6].name._M_string_length) && (*(int *)&in_RDI[5].options != 0)) {
    ktxApp::error(in_RDI,
                  "generation of mipmaps for 3d textures is not supported.\nA PR to add this feature will be gratefully accepted!"
                 );
    exit(1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&in_RDI[1].short_opts._M_string_length);
  if ((iVar2 != 0) &&
     (lVar3 = std::__cxx11::string::find_last_of((char)in_RDI + -0x28,0x2e), lVar3 == -1)) {
    std::__cxx11::string::append((char *)&in_RDI[1].short_opts._M_string_length);
  }
  if (*(int *)((long)&in_RDI[5].defaultVersion + 4) == 0) {
    local_1c = *(uint *)&in_RDI[6].name.field_2;
  }
  else {
    local_1c = 6;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[1].option_list.
                     super__Vector_base<argparser::option,_std::allocator<argparser::option>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (sVar4 < local_1c) {
    ktxApp::error(in_RDI,"too few input files.");
    exit(1);
  }
  return;
}

Assistant:

void
toktxApp::validateOptions()
{
    scApp::validateOptions();

    if (options.automipmap + options.genmipmap + options.mipmap > 1) {
        error("only one of --automipmap, --genmipmap and "
              "--mipmap may be specified.");
        usage();
        exit(1);
    }
    if ((options.automipmap || options.genmipmap) && options.levels > 1) {
        error("cannot specify --levels > 1 with --automipmap or --genmipmap.");
        usage();
        exit(1);
    }
    if (options.cubemap && options.lower_left_maps_to_s0t0) {
        error("cubemaps require images to have an upper-left origin. "
              "Ignoring --lower_left_maps_to_s0t0.");
        options.lower_left_maps_to_s0t0 = 0;
    }
    if (options.cubemap && options.depth > 0) {
        error("cubemaps cannot have 3D textures.");
        usage();
        exit(1);
    }
    if (options.layers && options.depth > 0) {
        error("cannot have 3D array textures.");
        usage();
        exit(1);
    }
    if (options.scale != 1.0 && options.resize) {
        error("only one of --scale and --resize can be specified.");
        usage();
        exit(1);
    }
    if (options.resize && options.mipmap) {
        error("only one of --resize and --mipmap can be specified.");
        usage();
        exit(1);
    }

    if (options.depth > 1 && options.genmipmap) {
        error("generation of mipmaps for 3d textures is not supported.\n"
              "A PR to add this feature will be gratefully accepted!");
        exit(1);
    }

    if (options.outfile.compare("-") != 0
            && options.outfile.find_last_of('.') == string::npos)
    {
        options.outfile.append(options.ktx2 ? ".ktx2" : ".ktx");
    }

    ktx_uint32_t requiredInputFiles = options.cubemap ? 6 : 1 * options.levels;
    if (requiredInputFiles > options.infiles.size()) {
        error("too few input files.");
        exit(1);
    }
    /* Whether there are enough input files for all the mipmap levels in
     * a full pyramid can only be checked when the first file has been
     * read and the size determined.
     */
}